

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O0

optional<OutputType> OutputTypeFromDestination(CTxDestination *dest)

{
  bool bVar1;
  optional<OutputType> *in_RDI;
  long in_FS_OFFSET;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffffc8;
  OutputType *in_stack_ffffffffffffffd0;
  _Optional_payload_base<OutputType> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::
          holds_alternative<PKHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                    (in_stack_ffffffffffffffc8);
  if (!bVar1) {
    bVar1 = std::
            holds_alternative<ScriptHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      (in_stack_ffffffffffffffc8);
    if (!bVar1) {
      bVar1 = std::
              holds_alternative<WitnessV0KeyHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                        (in_stack_ffffffffffffffc8);
      if (!bVar1) {
        bVar1 = std::
                holds_alternative<WitnessV0ScriptHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                          (in_stack_ffffffffffffffc8);
        if (!bVar1) {
          bVar1 = std::
                  holds_alternative<WitnessV1Taproot,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                            (in_stack_ffffffffffffffc8);
          if (!bVar1) {
            bVar1 = std::
                    holds_alternative<WitnessUnknown,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                              (in_stack_ffffffffffffffc8);
            if (!bVar1) {
              std::optional<OutputType>::optional((optional<OutputType> *)&local_10);
              goto LAB_019916da;
            }
          }
          std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
          goto LAB_019916da;
        }
      }
      std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
      goto LAB_019916da;
    }
  }
  std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
LAB_019916da:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<OutputType>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<OutputType> OutputTypeFromDestination(const CTxDestination& dest) {
    if (std::holds_alternative<PKHash>(dest) ||
        std::holds_alternative<ScriptHash>(dest)) {
        return OutputType::LEGACY;
    }
    if (std::holds_alternative<WitnessV0KeyHash>(dest) ||
        std::holds_alternative<WitnessV0ScriptHash>(dest)) {
        return OutputType::BECH32;
    }
    if (std::holds_alternative<WitnessV1Taproot>(dest) ||
        std::holds_alternative<WitnessUnknown>(dest)) {
        return OutputType::BECH32M;
    }
    return std::nullopt;
}